

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

_Bool arena_decay_init(arena_decay_t *decay,ssize_t decay_ms,arena_stats_decay_t *stats)

{
  _Bool _Var1;
  arena_decay_t *in_RDX;
  malloc_mutex_t *in_RSI;
  long in_RDI;
  malloc_mutex_lock_order_t in_stack_ffffffffffffffd8;
  witness_rank_t in_stack_ffffffffffffffdc;
  
  _Var1 = malloc_mutex_init(in_RSI,(char *)in_RDX,in_stack_ffffffffffffffdc,
                            in_stack_ffffffffffffffd8);
  if (!_Var1) {
    *(undefined1 *)(in_RDI + 0x70) = 0;
    arena_decay_reinit(in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    *(arena_decay_t **)(in_RDI + 0x6e8) = in_RDX;
  }
  return _Var1;
}

Assistant:

static bool
arena_decay_init(arena_decay_t *decay, ssize_t decay_ms,
    arena_stats_decay_t *stats) {
	if (config_debug) {
		for (size_t i = 0; i < sizeof(arena_decay_t); i++) {
			assert(((char *)decay)[i] == 0);
		}
		decay->ceil_npages = 0;
	}
	if (malloc_mutex_init(&decay->mtx, "decay", WITNESS_RANK_DECAY,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	decay->purging = false;
	arena_decay_reinit(decay, decay_ms);
	/* Memory is zeroed, so there is no need to clear stats. */
	if (config_stats) {
		decay->stats = stats;
	}
	return false;
}